

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O0

void operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>,viennamath::ct_constant<8l>>
               (rt_expr<viennamath::rt_expression_interface<double>_> *e,ct_constant<8L> *t,
               ct_constant<8L> *u,double t2,double u2)

{
  ct_constant<8L> *rhs;
  ct_constant<8L> *rhs_00;
  ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_div<double>,_viennamath::ct_constant<8L>_>
  local_42 [2];
  ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_div<double>,_viennamath::ct_constant<8L>_>
  local_3e;
  ct_constant<64L> local_3b [2];
  ct_constant<64L> local_39 [2];
  ct_constant<0L> local_37 [2];
  ct_constant<0L> local_35 [2];
  ct_constant<16L> local_33 [2];
  ct_constant<16L> local_31;
  double local_30;
  double u2_local;
  double t2_local;
  ct_constant<8L> *u_local;
  ct_constant<8L> *t_local;
  rt_expr<viennamath::rt_expression_interface<double>_> *e_local;
  
  local_30 = u2;
  u2_local = t2;
  t2_local = (double)u;
  u_local = t;
  t_local = (ct_constant<8L> *)e;
  viennamath::operator+<8L,_8L>(t,u);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>> *)t_local,&local_31);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,u2_local + local_30);
  viennamath::operator+<8L,_8L>((ct_constant<8L> *)t2_local,u_local);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>> *)t_local,local_33);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,local_30 + u2_local);
  viennamath::operator-<8L,_8L>(u_local,(ct_constant<8L> *)t2_local);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>> *)t_local,local_35);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,u2_local - local_30);
  viennamath::operator-<8L,_8L>((ct_constant<8L> *)t2_local,u_local);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>> *)t_local,local_37);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,local_30 - u2_local);
  viennamath::operator*<8L,_8L>(u_local,(ct_constant<8L> *)t2_local);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>> *)t_local,local_39);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,u2_local * local_30);
  viennamath::operator*<8L,_8L>((ct_constant<8L> *)t2_local,u_local);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>> *)t_local,local_3b);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,local_30 * u2_local);
  viennamath::operator/((type *)u_local,(ct_constant<8L> *)t2_local,rhs);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>> *)t_local,&local_3e);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,u2_local / local_30);
  viennamath::operator/((type *)t2_local,u_local,rhs_00);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>> *)t_local,local_42);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)t_local,local_30 / u2_local);
  return;
}

Assistant:

void operations_test(E & e, T const & t, U const & u, double t2, double u2)
{
  e = t + u; evaluations_test(e, t2 + u2);
  e = u + t; evaluations_test(e, u2 + t2);
  e = t - u; evaluations_test(e, t2 - u2);
  e = u - t; evaluations_test(e, u2 - t2);
  e = t * u; evaluations_test(e, t2 * u2);
  e = u * t; evaluations_test(e, u2 * t2);
  e = t / u; evaluations_test(e, t2 / u2);
  e = u / t; evaluations_test(e, u2 / t2);
}